

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_bin
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char cVar1;
  uint uVar2;
  anon_class_16_2_cb75083a_for_f_conflict f;
  int num_digits_00;
  buffer_appender<char> bVar3;
  string_view prefix;
  undefined4 uStack_3c;
  int num_digits;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this_local;
  
  if ((char)this->specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = this->specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits_00 = count_digits<1u,unsigned_long>(this->abs_value);
  bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  prefix = get_prefix(this);
  f._12_4_ = uStack_3c;
  f.num_digits = num_digits_00;
  f.this = this;
  bVar3 = write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_long>::on_bin()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    (bVar3,num_digits_00,prefix,this->specs,f);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }